

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexParser.cpp
# Opt level: O0

bool __thiscall
UnifiedRegex::Parser<UTF8EncodingPolicyBase<false>,_true>::AtSecondSingletonClassAtom
          (Parser<UTF8EncodingPolicyBase<false>,_true> *this)

{
  code *pcVar1;
  EncodedChar EVar2;
  bool bVar3;
  undefined4 *puVar4;
  Parser<UTF8EncodingPolicyBase<false>,_true> *this_local;
  
  EVar2 = ECLookahead(this,0);
  if (EVar2 != '-') {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                       ,0x773,"(ECLookahead() == \'-\')","ECLookahead() == \'-\'");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  EVar2 = ECLookahead(this,1);
  if ((EVar2 == '\\') &&
     ((((EVar2 = ECLookahead(this,2), EVar2 == 'D' || (EVar2 == 'S')) || (EVar2 == 'W')) ||
      (((EVar2 == 'd' || (EVar2 == 's')) || (EVar2 == 'w')))))) {
    this_local._7_1_ = false;
  }
  else {
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool Parser<P, IsLiteral>::AtSecondSingletonClassAtom()
    {
        Assert(ECLookahead() == '-');
        if (ECLookahead(1) == '\\')
        {
            switch (ECLookahead(2))
            {
            case 'd':
            case 'D':
            case 's':
            case 'S':
            case 'w':
            case 'W':
                // These all denote non-singleton sets
                return false;
            default:
                // fall-through for singleton
                break;
            }
        }
        return true;
    }